

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int i2cWriteBlockData(uint handle,uint reg,char *buf,uint count)

{
  FILE *__stream;
  int iVar1;
  my_smbus_data data;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,buf);
    fprintf(__stream,"%s %s: handle=%d reg=%d count=%d [%s]\n",myTimeStamp::buf,"i2cWriteBlockData",
            (ulong)handle,reg,(ulong)count,myBuf2Str::str);
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cWriteBlockData_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[handle].state == 2) {
      if ((i2cInfo[handle].funcs & 0x2000000) == 0) {
        iVar1 = -0x6b;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cWriteBlockData_cold_6();
        }
      }
      else if (reg < 0x100) {
        if (count - 0x21 < 0xffffffe0) {
          iVar1 = -0x51;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            i2cWriteBlockData_cold_4();
          }
        }
        else {
          if (count != 0) {
            memcpy(data.block + 1,buf,(ulong)count);
          }
          data.byte = (uint8_t)count;
          iVar1 = my_smbus_access((int)i2cInfo[handle].fd,'\0',(uint8_t)reg,5,&data);
          if (((iVar1 < 0) && (iVar1 = -0x52, 3 < gpioCfg.dbgLevel)) &&
             ((gpioCfg.internals >> 10 & 1) == 0)) {
            i2cWriteBlockData_cold_3();
          }
        }
      }
      else {
        iVar1 = -0x51;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cWriteBlockData_cold_5();
        }
      }
    }
    else {
      iVar1 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cWriteBlockData_cold_2();
      }
    }
  }
  else {
    iVar1 = -0x19;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cWriteBlockData_cold_7();
    }
  }
  return iVar1;
}

Assistant:

int i2cWriteBlockData(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   union my_smbus_data data;

   int i, status;

   DBG(DBG_USER, "handle=%d reg=%d count=%d [%s]",
      handle, reg, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BLOCK_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   if ((count < 1) || (count > 32))
      SOFT_ERROR(PI_BAD_PARAM, "bad count (%d)", count);

   for (i=1; i<=count; i++) data.block[i] = buf[i-1];
   data.block[0] = count;

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            reg,
            PI_I2C_SMBUS_BLOCK_DATA,
            &data);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}